

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O3

void __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::do_line(jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
          *this,triplet<unsigned_char> *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  pixel_type *ppVar10;
  pixel_type *ppVar11;
  uint uVar12;
  sample_type sVar13;
  sample_type sVar14;
  sample_type sVar15;
  uint uVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint predicted;
  int iVar24;
  uint index;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  int qs;
  int qs_00;
  uint uVar29;
  
  if (this->width_ != 0) {
    index = 0;
    do {
      ppVar10 = this->previous_line_;
      ppVar11 = this->current_line_;
      iVar24 = index - 1;
      bVar1 = ppVar11[iVar24].field_0.v1;
      uVar26 = (uint)bVar1;
      bVar2 = ppVar11[iVar24].field_1.v2;
      uVar27 = (uint)bVar2;
      bVar3 = ppVar11[iVar24].field_2.v3;
      uVar20 = (uint)bVar3;
      bVar4 = ppVar10[iVar24].field_0.v1;
      uVar21 = (uint)ppVar10[iVar24].field_1.v2;
      uVar22 = (uint)ppVar10[iVar24].field_2.v3;
      bVar5 = ppVar10[(int)index].field_0.v1;
      bVar6 = ppVar10[(int)index].field_1.v2;
      uVar23 = index + 1;
      bVar7 = ppVar10[(int)uVar23].field_1.v2;
      bVar8 = ppVar10[(int)uVar23].field_2.v3;
      bVar9 = ppVar10[(int)index].field_2.v3;
      uVar16 = (uint)bVar9;
      uVar28 = (uint)bVar5;
      iVar17 = quantize_gradient(this,ppVar10[(int)uVar23].field_0.v1 - uVar28);
      uVar25 = (uint)bVar5 - (uint)bVar4;
      iVar18 = quantize_gradient(this,uVar25);
      iVar19 = quantize_gradient(this,bVar4 - uVar26);
      qs = (iVar17 * 9 + iVar18) * 9 + iVar19;
      uVar29 = (uint)bVar6;
      iVar17 = quantize_gradient(this,bVar7 - uVar29);
      iVar18 = quantize_gradient(this,bVar6 - uVar21);
      iVar19 = quantize_gradient(this,uVar21 - uVar27);
      qs_00 = (iVar17 * 9 + iVar18) * 9 + iVar19;
      iVar17 = quantize_gradient(this,bVar8 - uVar16);
      iVar18 = quantize_gradient(this,uVar16 - uVar22);
      iVar19 = quantize_gradient(this,uVar22 - uVar20);
      iVar24 = (iVar17 * 9 + iVar18) * 9 + iVar19;
      if ((qs_00 == 0 && qs == 0) && iVar24 == 0) {
        iVar17 = do_run_mode(this,index,(encoder_strategy *)0x0);
        uVar23 = iVar17 + index;
      }
      else {
        uVar12 = -(uint)(bVar5 < bVar1);
        predicted = uVar28;
        if ((-1 < (int)(bVar4 - uVar26 ^ uVar12)) &&
           (predicted = uVar26, -1 < (int)(uVar25 ^ uVar12))) {
          predicted = uVar28 + (uVar26 - bVar4);
        }
        sVar13 = do_regular(this,qs,(uint)this->current_line_[(int)index].field_0.v1,predicted,
                            (encoder_strategy *)0x0);
        uVar25 = -(uint)(bVar6 < bVar2);
        uVar26 = uVar29;
        if ((-1 < (int)(uVar21 - uVar27 ^ uVar25)) &&
           (uVar26 = uVar27, -1 < (int)(bVar6 - uVar21 ^ uVar25))) {
          uVar26 = uVar29 + (uVar27 - uVar21);
        }
        sVar14 = do_regular(this,qs_00,(uint)this->current_line_[(int)index].field_1.v2,uVar26,
                            (encoder_strategy *)0x0);
        uVar21 = -(uint)(bVar9 < bVar3);
        uVar25 = uVar16;
        if ((-1 < (int)(uVar22 - uVar20 ^ uVar21)) &&
           (uVar25 = uVar20, -1 < (int)(uVar16 - uVar22 ^ uVar21))) {
          uVar25 = uVar16 + (uVar20 - uVar22);
        }
        sVar15 = do_regular(this,iVar24,(uint)this->current_line_[(int)index].field_2.v3,uVar25,
                            (encoder_strategy *)0x0);
        ppVar10 = this->current_line_;
        ppVar10[(int)index].field_0.v1 = sVar13;
        ppVar10[(int)index].field_1.v2 = sVar14;
        ppVar10[(int)index].field_2.v3 = sVar15;
      }
      index = uVar23;
    } while (uVar23 < this->width_);
  }
  return;
}

Assistant:

void do_line(triplet<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const triplet<sample_type> ra{current_line_[index - 1]};
            const triplet<sample_type> rc{previous_line_[index - 1]};
            const triplet<sample_type> rb{previous_line_[index]};
            const triplet<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                triplet<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }